

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000011;
  precise_unit pVar6;
  precise_unit pVar7;
  string ustring;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  uVar4 = std::__cxx11::string::find
                    ((char)unit_string,CONCAT71(in_register_00000011,mchar) & 0xffffffff);
  if (uVar4 != 0xffffffffffffffff) {
    lVar5 = std::__cxx11::string::find((char)unit_string,(ulong)(uint)(int)mchar);
    if (lVar5 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_90);
      std::__cxx11::string::erase((ulong)&local_90,uVar4);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
      pVar6 = unit_quick_match(&local_70,match_flags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pVar6._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar6.multiplier_)) goto LAB_0016a76a;
    }
    std::__cxx11::string::_M_assign((string *)&local_90);
    do {
      if (uVar4 == local_88 - 1) {
        std::__cxx11::string::erase((ulong)&local_90,uVar4);
      }
      else {
        cVar1 = local_90[uVar4 + 1];
        if ((byte)(cVar1 - 0x30U) < 10) {
          if ((uVar4 != 0) && (local_90[uVar4 - 1] != '^')) {
            std::__cxx11::string::insert((ulong)&local_90,uVar4,'\x01');
          }
        }
        else {
          if (cVar1 == mchar) goto LAB_0016a764;
          if ((cVar1 != '(') && (cVar1 != '[')) {
            local_90[uVar4] = 0x2a;
          }
        }
      }
      uVar4 = std::__cxx11::string::find((char)&local_90,(ulong)(uint)(int)mchar);
      sVar2 = local_88;
    } while (uVar4 != 0xffffffffffffffff);
    if ((local_88 != unit_string->_M_string_length) ||
       ((local_88 != 0 &&
        (iVar3 = bcmp(local_90,(unit_string->_M_dataplus)._M_p,local_88), iVar3 != 0)))) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_90,local_90 + sVar2);
      pVar7 = unit_from_string_internal(&local_50,match_flags | 0x400000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pVar6.base_units_ = (unit_data)0xfa94a488;
      pVar6.commodity_ = 0;
      pVar6.multiplier_ = NAN;
      if ((pVar7._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar7.multiplier_)) {
        pVar6 = pVar7;
      }
      goto LAB_0016a76a;
    }
  }
LAB_0016a764:
  pVar6.base_units_ = (unit_data)0xfa94a488;
  pVar6.commodity_ = 0;
  pVar6.multiplier_ = NAN;
LAB_0016a76a:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return pVar6;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}